

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O2

void __thiscall fineftp::FtpSession::handleFtpCommandRMD(FtpSession *this,string *param)

{
  element_type *peVar1;
  int iVar2;
  string local_path;
  allocator local_51;
  string local_50;
  string local_30;
  
  peVar1 = (this->logged_in_user_).super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    ::std::__cxx11::string::string((string *)&local_50,"Not logged in",(allocator *)&local_30);
    sendFtpMessage(this,NOT_LOGGED_IN,&local_50);
  }
  else if ((peVar1->permissions_ & DirDelete) == None) {
    ::std::__cxx11::string::string((string *)&local_50,"Permission denied",(allocator *)&local_30);
    sendFtpMessage(this,ACTION_NOT_TAKEN,&local_50);
  }
  else {
    toLocalPath(&local_50,this,param);
    iVar2 = rmdir(local_50._M_dataplus._M_p);
    if (iVar2 == 0) {
      ::std::__cxx11::string::string((string *)&local_30,"Successfully removed directory",&local_51)
      ;
      sendFtpMessage(this,FILE_ACTION_COMPLETED,&local_30);
    }
    else {
      ::std::__cxx11::string::string((string *)&local_30,"Unable to remove directory",&local_51);
      sendFtpMessage(this,ACTION_NOT_TAKEN,&local_30);
    }
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  ::std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void FtpSession::handleFtpCommandRMD(const std::string& param)
  {
    if (!logged_in_user_)
    {
      sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN,    "Not logged in");
      return;
    }
    if (static_cast<int>(logged_in_user_->permissions_ & Permission::DirDelete) == 0)
    {
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Permission denied");
      return;
    }

    std::string local_path = toLocalPath(param);

#ifdef WIN32
    if (RemoveDirectoryW(StrConvert::Utf8ToWide(local_path).c_str()) != 0)
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_COMPLETED, "Successfully removed directory");
      return;
    }
    else
    {
      // If would be a good idea to return a 4xx error code here (-> temp error)
      // (e.g. FILE_ACTION_NOT_TAKEN), but RFC 959 assumes that all directory
      // errors are permanent.
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Unable to remove directory: " + GetLastErrorStr());
      return;
    }
#else
    if (rmdir(local_path.c_str()) == 0)
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_COMPLETED, "Successfully removed directory");
      return;
    }
    else
    {
      // If would be a good idea to return a 4xx error code here (-> temp error)
      // (e.g. FILE_ACTION_NOT_TAKEN), but RFC 959 assumes that all directory
      // errors are permanent.
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Unable to remove directory");
      return;
    }
#endif

  }